

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall
helics::CommonCore::removeTargetFromInterface(CommonCore *this,ActionMessage *command)

{
  GlobalFederateId federateID;
  FederateState *this_00;
  
  if ((command->dest_id).gid != (this->filterFedID)._M_i.gid) {
    do {
      federateID.gid = (command->dest_id).gid;
      if (federateID.gid == (this->translatorFedID)._M_i.gid) {
        TranslatorFederate::handleMessage(this->translatorFed,command);
        return;
      }
      if (command->messageAction != cmd_remove_filter) {
        this_00 = getFederateCore(this,federateID);
        if (this_00 != (FederateState *)0x0) {
          FederateState::addAction(this_00,command);
          return;
        }
        return;
      }
      (command->dest_id).gid = (this->filterFedID)._M_i.gid;
    } while ((command->dest_id).gid != (this->filterFedID)._M_i.gid);
  }
  FilterFederate::handleMessage(this->filterFed,command);
  return;
}

Assistant:

void CommonCore::removeTargetFromInterface(ActionMessage& command)
{
    if (command.dest_id == filterFedID) {
        filterFed->handleMessage(command);
    } else if (command.dest_id == translatorFedID) {
        translatorFed->handleMessage(command);
    } else {  // just forward these to the appropriate federate
        if (command.action() == CMD_REMOVE_FILTER) {
            command.dest_id = filterFedID;
            removeTargetFromInterface(command);
        } else {
            auto* fed = getFederateCore(command.dest_id);
            if (fed != nullptr) {
                fed->addAction(command);
            }
        }
    }
}